

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsInter.c
# Opt level: O0

sat_solver * Abc_MfsCreateSolverResub(Mfs_Man_t *p,int *pCands,int nCands,int fInvert)

{
  Aig_Man_t *p_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  lit lVar4;
  int local_50;
  int local_4c;
  int c;
  int i;
  int iVar;
  int status;
  int Lits [2];
  Aig_Obj_t *pObjPo;
  sat_solver *pSat;
  int fInvert_local;
  int nCands_local;
  int *pCands_local;
  Mfs_Man_t *p_local;
  
  p_00 = p->pAigWin;
  iVar2 = Aig_ManCoNum(p->pAigWin);
  iVar3 = Vec_PtrSize(p->vDivs);
  Lits = (int  [2])Aig_ManCo(p_00,(iVar2 - iVar3) + -1);
  iVar = toLitCond(p->pCnf->pVarNums[*(int *)((long)Lits + 0x24)],fInvert);
  Vec_IntClear(p->vProjVarsCnf);
  local_4c = Aig_ManCoNum(p->pAigWin);
  iVar2 = Vec_PtrSize(p->vDivs);
  for (local_4c = local_4c - iVar2; iVar2 = Vec_PtrSize(p->pAigWin->vCos), local_4c < iVar2;
      local_4c = local_4c + 1) {
    Lits = (int  [2])Vec_PtrEntry(p->pAigWin->vCos,local_4c);
    if (p->pCnf->pVarNums[*(int *)((long)Lits + 0x24)] < 0) {
      __assert_fail("p->pCnf->pVarNums[pObjPo->Id] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsInter.c"
                    ,0x66,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
    }
    Vec_IntPush(p->vProjVarsCnf,p->pCnf->pVarNums[*(int *)((long)Lits + 0x24)]);
  }
  iVar2 = Vec_IntSize(p->vProjVarsCnf);
  iVar3 = Vec_PtrSize(p->vDivs);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsInter.c"
                  ,0x69,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
  }
  p_local = (Mfs_Man_t *)sat_solver_new();
  iVar2 = p->pCnf->nVars;
  iVar3 = Vec_PtrSize(p->vDivs);
  sat_solver_setnvars((sat_solver *)p_local,iVar2 * 2 + iVar3);
  if (pCands != (int *)0x0) {
    sat_solver_store_alloc((sat_solver *)p_local);
  }
  for (local_4c = 0; local_4c < p->pCnf->nClauses; local_4c = local_4c + 1) {
    iVar2 = sat_solver_addclause
                      ((sat_solver *)p_local,p->pCnf->pClauses[local_4c],
                       p->pCnf->pClauses[local_4c + 1]);
    if (iVar2 == 0) {
      sat_solver_delete((sat_solver *)p_local);
      return (sat_solver *)0x0;
    }
  }
  iVar2 = sat_solver_addclause((sat_solver *)p_local,&iVar,&status);
  if (iVar2 == 0) {
    sat_solver_delete((sat_solver *)p_local);
    p_local = (Mfs_Man_t *)0x0;
  }
  else {
    if (p->pPars->fOneHotness != 0) {
      p->pSat = (sat_solver *)p_local;
      iVar2 = Abc_NtkAddOneHotness(p);
      if (iVar2 == 0) {
        return (sat_solver *)0x0;
      }
      p->pSat = (sat_solver *)0x0;
    }
    if (pCands != (int *)0x0) {
      sat_solver_store_mark_clauses_a((sat_solver *)p_local);
    }
    for (local_4c = 0; local_4c < p->pCnf->nLiterals; local_4c = local_4c + 1) {
      piVar1 = *p->pCnf->pClauses;
      piVar1[local_4c] = p->pCnf->nVars * 2 + piVar1[local_4c];
    }
    for (local_4c = 0; local_4c < p->pCnf->nClauses; local_4c = local_4c + 1) {
      iVar2 = sat_solver_addclause
                        ((sat_solver *)p_local,p->pCnf->pClauses[local_4c],
                         p->pCnf->pClauses[local_4c + 1]);
      if (iVar2 == 0) {
        sat_solver_delete((sat_solver *)p_local);
        return (sat_solver *)0x0;
      }
    }
    if (p->pPars->fOneHotness != 0) {
      p->pSat = (sat_solver *)p_local;
      iVar2 = Abc_NtkAddOneHotness(p);
      if (iVar2 == 0) {
        return (sat_solver *)0x0;
      }
      p->pSat = (sat_solver *)0x0;
    }
    for (local_4c = 0; local_4c < p->pCnf->nLiterals; local_4c = local_4c + 1) {
      piVar1 = *p->pCnf->pClauses;
      piVar1[local_4c] = piVar1[local_4c] + p->pCnf->nVars * -2;
    }
    iVar2 = p->pCnf->nVars;
    lVar4 = lit_neg(iVar);
    iVar = iVar2 * 2 + lVar4;
    iVar2 = sat_solver_addclause((sat_solver *)p_local,&iVar,&status);
    if (iVar2 == 0) {
      sat_solver_delete((sat_solver *)p_local);
      p_local = (Mfs_Man_t *)0x0;
    }
    else if (pCands == (int *)0x0) {
      Vec_IntClear(p->vProjVarsSat);
      for (local_4c = 0; iVar2 = Vec_IntSize(p->vProjVarsCnf), local_4c < iVar2;
          local_4c = local_4c + 1) {
        iVar2 = Vec_IntEntry(p->vProjVarsCnf,local_4c);
        iVar2 = Abc_MfsSatAddXor((sat_solver *)p_local,iVar2,iVar2 + p->pCnf->nVars,
                                 p->pCnf->nVars * 2 + local_4c);
        if (iVar2 == 0) {
          sat_solver_delete((sat_solver *)p_local);
          return (sat_solver *)0x0;
        }
        Vec_IntPush(p->vProjVarsSat,p->pCnf->nVars * 2 + local_4c);
      }
      iVar2 = Vec_IntSize(p->vProjVarsCnf);
      iVar3 = Vec_IntSize(p->vProjVarsSat);
      if (iVar2 != iVar3) {
        __assert_fail("Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsInter.c"
                      ,0xd3,"sat_solver *Abc_MfsCreateSolverResub(Mfs_Man_t *, int *, int, int)");
      }
      iVar2 = sat_solver_simplify((sat_solver *)p_local);
      if (iVar2 == 0) {
        sat_solver_delete((sat_solver *)p_local);
        p_local = (Mfs_Man_t *)0x0;
      }
    }
    else {
      for (local_50 = 0; local_50 < nCands; local_50 = local_50 + 1) {
        iVar2 = lit_var(pCands[local_50]);
        iVar2 = iVar2 + p->pCnf->nVars * -2;
        iVar3 = Vec_IntEntry(p->vProjVarsCnf,iVar2);
        iVar2 = Abc_MfsSatAddXor((sat_solver *)p_local,iVar3,iVar3 + p->pCnf->nVars,
                                 p->pCnf->nVars * 2 + iVar2);
        if (iVar2 == 0) {
          sat_solver_delete((sat_solver *)p_local);
          return (sat_solver *)0x0;
        }
        iVar2 = sat_solver_addclause
                          ((sat_solver *)p_local,pCands + local_50,pCands + (long)local_50 + 1);
        if (iVar2 == 0) {
          sat_solver_delete((sat_solver *)p_local);
          return (sat_solver *)0x0;
        }
      }
      sat_solver_store_mark_roots((sat_solver *)p_local);
    }
  }
  return (sat_solver *)p_local;
}

Assistant:

sat_solver * Abc_MfsCreateSolverResub( Mfs_Man_t * p, int * pCands, int nCands, int fInvert )
{
    sat_solver * pSat;
    Aig_Obj_t * pObjPo;
    int Lits[2], status, iVar, i, c;

    // get the literal for the output of F
    pObjPo = Aig_ManCo( p->pAigWin, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) - 1 );
    Lits[0] = toLitCond( p->pCnf->pVarNums[pObjPo->Id], fInvert );

    // collect the outputs of the divisors
    Vec_IntClear( p->vProjVarsCnf );
    Vec_PtrForEachEntryStart( Aig_Obj_t *, p->pAigWin->vCos, pObjPo, i, Aig_ManCoNum(p->pAigWin) - Vec_PtrSize(p->vDivs) )
    {
        assert( p->pCnf->pVarNums[pObjPo->Id] >= 0 );
        Vec_IntPush( p->vProjVarsCnf, p->pCnf->pVarNums[pObjPo->Id] );
    }
    assert( Vec_IntSize(p->vProjVarsCnf) == Vec_PtrSize(p->vDivs) );

    // start the solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * p->pCnf->nVars + Vec_PtrSize(p->vDivs) );
    if ( pCands )
        sat_solver_store_alloc( pSat );

    // load the first copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add the clause for the first output of F
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }

    // bookmark the clauses of A
    if ( pCands )
        sat_solver_store_mark_clauses_a( pSat );

    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] += 2 * p->pCnf->nVars;
    // load the second copy of the clauses
    for ( i = 0; i < p->pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, p->pCnf->pClauses[i], p->pCnf->pClauses[i+1] ) )
        {
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    // add one-hotness constraints
    if ( p->pPars->fOneHotness )
    {
        p->pSat = pSat;
        if ( !Abc_NtkAddOneHotness( p ) )
            return NULL;
        p->pSat = NULL;
    }
    // transform the literals
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
        p->pCnf->pClauses[0][i] -= 2 * p->pCnf->nVars;
    // add the clause for the second output of F
    Lits[0] = 2 * p->pCnf->nVars + lit_neg( Lits[0] );
    if ( !sat_solver_addclause( pSat, Lits, Lits+1 ) )
    {
        sat_solver_delete( pSat );
        return NULL;
    }

    if ( pCands )
    {
        // add relevant clauses for EXOR gates
        for ( c = 0; c < nCands; c++ )
        {
            // get the variable number of this divisor
            i = lit_var( pCands[c] ) - 2 * p->pCnf->nVars;
            // get the corresponding SAT variable
            iVar = Vec_IntEntry( p->vProjVarsCnf, i );
            // add the corresponding EXOR gate
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            // add the corresponding clause
            if ( !sat_solver_addclause( pSat, pCands + c, pCands + c + 1 ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
        }
        // bookmark the roots
        sat_solver_store_mark_roots( pSat );
    }
    else
    {
        // add the clauses for the EXOR gates - and remember their outputs
        Vec_IntClear( p->vProjVarsSat );
        Vec_IntForEachEntry( p->vProjVarsCnf, iVar, i )
        {
            if ( !Abc_MfsSatAddXor( pSat, iVar, iVar + p->pCnf->nVars, 2 * p->pCnf->nVars + i ) )
            {
                sat_solver_delete( pSat );
                return NULL;
            }
            Vec_IntPush( p->vProjVarsSat, 2 * p->pCnf->nVars + i );
        }
        assert( Vec_IntSize(p->vProjVarsCnf) == Vec_IntSize(p->vProjVarsSat) );
        // simplify the solver
        status = sat_solver_simplify(pSat);
        if ( status == 0 )
        {
//            printf( "Abc_MfsCreateSolverResub(): SAT solver construction has failed. Skipping node.\n" );
            sat_solver_delete( pSat );
            return NULL;
        }
    }
    return pSat;
}